

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_common.c
# Opt level: O0

lzma_ret lzma_stream_flags_compare(lzma_stream_flags *a,lzma_stream_flags *b)

{
  _Bool _Var1;
  lzma_stream_flags *b_local;
  lzma_stream_flags *a_local;
  
  if ((a->version == 0) && (b->version == 0)) {
    if ((a->check < 0x10) && (b->check < 0x10)) {
      if (a->check == b->check) {
        if ((a->backward_size != 0xffffffffffffffff) && (b->backward_size != 0xffffffffffffffff)) {
          _Var1 = is_backward_size_valid(a);
          if ((!_Var1) || (_Var1 = is_backward_size_valid(b), !_Var1)) {
            return LZMA_PROG_ERROR;
          }
          if (a->backward_size != b->backward_size) {
            return LZMA_DATA_ERROR;
          }
        }
        a_local._4_4_ = LZMA_OK;
      }
      else {
        a_local._4_4_ = LZMA_DATA_ERROR;
      }
    }
    else {
      a_local._4_4_ = LZMA_PROG_ERROR;
    }
  }
  else {
    a_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return a_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_flags_compare(
		const lzma_stream_flags *a, const lzma_stream_flags *b)
{
	// We can compare only version 0 structures.
	if (a->version != 0 || b->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Check type
	if ((unsigned int)(a->check) > LZMA_CHECK_ID_MAX
			|| (unsigned int)(b->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (a->check != b->check)
		return LZMA_DATA_ERROR;

	// Backward Sizes are compared only if they are known in both.
	if (a->backward_size != LZMA_VLI_UNKNOWN
			&& b->backward_size != LZMA_VLI_UNKNOWN) {
		if (!is_backward_size_valid(a) || !is_backward_size_valid(b))
			return LZMA_PROG_ERROR;

		if (a->backward_size != b->backward_size)
			return LZMA_DATA_ERROR;
	}

	return LZMA_OK;
}